

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idaa.c
# Opt level: O2

int IDAInitBS(void *ida_mem,int which,IDAResFnBS resS,sunrealtype tB0,N_Vector yyB0,N_Vector ypB0)

{
  int *piVar1;
  int iVar2;
  undefined8 uVar3;
  int error_code;
  char *msgfmt;
  double *pdVar4;
  
  if (ida_mem == (void *)0x0) {
    msgfmt = "ida_mem = NULL illegal.";
    error_code = -0x14;
    ida_mem = (IDAMem)0x0;
    iVar2 = 0x342;
  }
  else if (*(int *)((long)ida_mem + 0x848) == 0) {
    msgfmt = "Illegal attempt to call before calling IDAadjInit.";
    error_code = -0x65;
    iVar2 = 0x34d;
  }
  else {
    pdVar4 = *(double **)((long)ida_mem + 0x840);
    if ((tB0 < *pdVar4) || (pdVar4[1] <= tB0 && tB0 != pdVar4[1])) {
      msgfmt = 
      "The initial time tB0 is outside the interval over which the forward problem was solved.";
      error_code = -0x68;
      iVar2 = 0x357;
    }
    else if (*(int *)(pdVar4 + 0x17) == 0) {
      msgfmt = 
      "At least one backward problem requires sensitivities, but they were not stored for interpolation."
      ;
      error_code = -0x16;
      iVar2 = 0x360;
    }
    else {
      if (which < *(int *)(pdVar4 + 7)) {
        pdVar4 = pdVar4 + 6;
        while ((piVar1 = (int *)*pdVar4, piVar1 != (int *)0x0 && (*piVar1 != which))) {
          pdVar4 = (double *)(piVar1 + 0x20);
        }
        iVar2 = IDAInit(*(void **)(piVar1 + 4),IDAAres,tB0,yyB0,ypB0);
        if (iVar2 != 0) {
          return iVar2;
        }
        piVar1[6] = 1;
        *(IDAResFnBS *)(piVar1 + 10) = resS;
        *(sunrealtype *)(piVar1 + 2) = tB0;
        uVar3 = N_VClone(yyB0);
        *(undefined8 *)(piVar1 + 0x1c) = uVar3;
        uVar3 = N_VClone(ypB0);
        *(undefined8 *)(piVar1 + 0x1e) = uVar3;
        N_VScale(0x3ff0000000000000,yyB0,*(undefined8 *)(piVar1 + 0x1c));
        N_VScale(0x3ff0000000000000,ypB0,*(undefined8 *)(piVar1 + 0x1e));
        return 0;
      }
      msgfmt = "Illegal value for which.";
      error_code = -0x16;
      iVar2 = 0x369;
    }
  }
  IDAProcessError((IDAMem)ida_mem,error_code,iVar2,"IDAInitBS",
                  "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idaa.c"
                  ,msgfmt);
  return error_code;
}

Assistant:

int IDAInitBS(void* ida_mem, int which, IDAResFnBS resS, sunrealtype tB0,
              N_Vector yyB0, N_Vector ypB0)
{
  IDAadjMem IDAADJ_mem;
  IDAMem IDA_mem;
  IDABMem IDAB_mem;
  void* ida_memB;
  int flag;

  if (ida_mem == NULL)
  {
    IDAProcessError(NULL, IDA_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSGAM_NULL_IDAMEM);
    return (IDA_MEM_NULL);
  }
  IDA_mem = (IDAMem)ida_mem;

  SUNDIALS_MARK_FUNCTION_BEGIN(IDA_PROFILER);

  /* Is ASA initialized ? */
  if (IDA_mem->ida_adjMallocDone == SUNFALSE)
  {
    IDAProcessError(IDA_mem, IDA_NO_ADJ, __LINE__, __func__, __FILE__,
                    MSGAM_NO_ADJ);
    SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
    return (IDA_NO_ADJ);
  }
  IDAADJ_mem = IDA_mem->ida_adj_mem;

  /* Check the initial time for this backward problem against the adjoint data. */
  if ((tB0 < IDAADJ_mem->ia_tinitial) || (tB0 > IDAADJ_mem->ia_tfinal))
  {
    IDAProcessError(IDA_mem, IDA_BAD_TB0, __LINE__, __func__, __FILE__,
                    MSGAM_BAD_TB0);
    SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
    return (IDA_BAD_TB0);
  }

  /* Were sensitivities active during the forward integration? */
  if (!IDAADJ_mem->ia_storeSensi)
  {
    IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSGAM_BAD_SENSI);
    SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
    return (IDA_ILL_INPUT);
  }

  /* Check the value of which */
  if (which >= IDAADJ_mem->ia_nbckpbs)
  {
    IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSGAM_BAD_WHICH);
    SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
    return (IDA_ILL_INPUT);
  }

  /* Find the IDABMem entry in the linked list corresponding to 'which'. */
  IDAB_mem = IDAADJ_mem->IDAB_mem;
  while (IDAB_mem != NULL)
  {
    if (which == IDAB_mem->ida_index) { break; }
    /* advance */
    IDAB_mem = IDAB_mem->ida_next;
  }

  /* Get the IDAMem corresponding to this backward problem. */
  ida_memB = (void*)IDAB_mem->IDA_mem;

  /* Allocate and set the IDAS object */
  flag = IDAInit(ida_memB, IDAAres, tB0, yyB0, ypB0);

  if (flag != IDA_SUCCESS)
  {
    SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
    return (flag);
  }

  /* Copy residual function pointer in IDAB_mem. */
  IDAB_mem->ida_res_withSensi = SUNTRUE;
  IDAB_mem->ida_resS          = resS;

  /* Allocate space and initialize the yy and yp vectors. */
  IDAB_mem->ida_t0 = tB0;
  IDAB_mem->ida_yy = N_VClone(yyB0);
  IDAB_mem->ida_yp = N_VClone(ypB0);
  N_VScale(ONE, yyB0, IDAB_mem->ida_yy);
  N_VScale(ONE, ypB0, IDAB_mem->ida_yp);

  SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
  return (IDA_SUCCESS);
}